

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseEnumDefinition
          (Parser *this,EnumDescriptorProto *enum_type,LocationRecorder *enum_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  string *output;
  undefined1 local_48 [8];
  LocationRecorder location;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *enum_location_local;
  EnumDescriptorProto *enum_type_local;
  Parser *this_local;
  
  location.location_ = (Location *)containing_file;
  bVar1 = Consume(this,"enum");
  if (bVar1) {
    LocationRecorder::LocationRecorder((LocationRecorder *)local_48,enum_location,1);
    LocationRecorder::RecordLegacyLocation
              ((LocationRecorder *)local_48,&enum_type->super_Message,NAME);
    output = EnumDescriptorProto::mutable_name_abi_cxx11_(enum_type);
    bVar1 = ConsumeIdentifier(this,output,"Expected enum name.");
    if (!bVar1) {
      this_local._7_1_ = 0;
    }
    LocationRecorder::~LocationRecorder((LocationRecorder *)local_48);
    if (bVar1) {
      bVar1 = ParseEnumBlock(this,enum_type,enum_location,(FileDescriptorProto *)location.location_)
      ;
      if (bVar1) {
        bVar1 = ValidateEnum(this,enum_type);
        if (bVar1) {
          this_local._7_1_ = 1;
        }
        else {
          this_local._7_1_ = 0;
        }
      }
      else {
        this_local._7_1_ = 0;
      }
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseEnumDefinition(EnumDescriptorProto* enum_type,
                                 const LocationRecorder& enum_location,
                                 const FileDescriptorProto* containing_file) {
  DO(Consume("enum"));

  {
    LocationRecorder location(enum_location,
                              EnumDescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(enum_type,
                                  DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(enum_type->mutable_name(), "Expected enum name."));
  }

  DO(ParseEnumBlock(enum_type, enum_location, containing_file));

  DO(ValidateEnum(enum_type));

  return true;
}